

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

Split * __thiscall
embree::avx::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<true>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  long lVar13;
  ulong uVar14;
  runtime_error *this_00;
  undefined8 *puVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  undefined1 (*pauVar20) [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  BinMapping<32UL> mapping;
  BinBoundsAndCenter binBoundsAndCenter;
  task_group_context context;
  Binner binner;
  vfloat4 rAreas [32];
  anon_class_24_3_4f408fa6 local_1f50;
  blocked_range<unsigned_long> local_1f30;
  anon_class_8_1_b5464bae local_1f10;
  PrimRef *local_1f08;
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [16];
  anon_class_16_2_ed117de8_conflict14 local_1ed0;
  BinBoundsAndCenter local_1ec0;
  task_group_context local_1e80 [3];
  undefined4 auStack_1cd0 [4];
  undefined4 auStack_1cc0 [4];
  undefined4 auStack_1cb0 [4];
  undefined4 auStack_1ca0 [4];
  undefined4 auStack_1c90 [4];
  undefined1 local_1c80 [3580];
  undefined4 uStack_e84;
  undefined1 local_e80 [20];
  float afStack_e6c [911];
  
  puVar15 = (undefined8 *)(local_1c80 + 0xc00);
  for (lVar13 = 0x50; lVar13 != 0xc50; lVar13 = lVar13 + 0x60) {
    *(undefined4 *)((long)auStack_1c90 + lVar13) = 0x7f800000;
    *(undefined4 *)((long)auStack_1c90 + lVar13 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_1c90 + lVar13 + 8) = 0x7f800000;
    *(undefined4 *)((long)auStack_1c90 + lVar13 + 0xc) = 0x7f800000;
    *(undefined4 *)(local_1c80 + lVar13) = 0xff800000;
    *(undefined4 *)(local_1c80 + lVar13 + 4) = 0xff800000;
    *(undefined4 *)(local_1c80 + lVar13 + 8) = 0xff800000;
    *(undefined4 *)(local_1c80 + lVar13 + 0xc) = 0xff800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar13) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar13 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar13 + 8) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cb0 + lVar13 + 0xc) = 0x7f800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar13) = 0xff800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar13 + 4) = 0xff800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar13 + 8) = 0xff800000;
    *(undefined4 *)((long)auStack_1ca0 + lVar13 + 0xc) = 0xff800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar13) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar13 + 4) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar13 + 8) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cd0 + lVar13 + 0xc) = 0x7f800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar13) = 0xff800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar13 + 4) = 0xff800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar13 + 8) = 0xff800000;
    *(undefined4 *)((long)auStack_1cc0 + lVar13 + 0xc) = 0xff800000;
    *puVar15 = 0;
    puVar15[1] = 0;
    puVar15 = puVar15 + 2;
  }
  uVar4 = (set->super_range<unsigned_long>)._begin;
  uVar5 = (set->super_range<unsigned_long>)._end;
  fVar21 = (float)(uVar5 - uVar4) * 0.05 + 4.0;
  uVar14 = (ulong)fVar21;
  uVar14 = (long)(fVar21 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  local_1f00._0_8_ = 0x20;
  if (uVar14 < 0x20) {
    local_1f00._0_8_ = uVar14;
  }
  local_1f10.mapping = (BinMapping<32UL> *)local_1f00;
  local_1f00._16_16_ = *(undefined1 (*) [16])&(set->super_CentGeomBBox3fa).centBounds.lower.field_0;
  auVar27 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       local_1f00._16_16_);
  auVar26._8_4_ = 0x704ec3d;
  auVar26._0_8_ = 0x704ec3d0704ec3d;
  auVar26._12_4_ = 0x704ec3d;
  auVar34 = vmaxps_avx(auVar26,auVar27);
  auVar27 = vcmpps_avx(auVar34,auVar26,6);
  auVar26 = vshufps_avx(ZEXT416((uint)((float)(long)local_1f00._0_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_1f00._0_8_ * 0.99)),0);
  auVar34 = vdivps_avx(auVar26,auVar34);
  local_1ee0 = vandps_avx(auVar27,auVar34);
  local_1ec0.scene = this->scene;
  local_1f50.binBoundsAndCenter = &local_1ec0;
  local_1ec0.space.vx.field_0._0_8_ = *(undefined8 *)&(space->vx).field_0;
  local_1ec0.space.vx.field_0._8_8_ = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_1ec0.space.vy.field_0._0_8_ = *(undefined8 *)&(space->vy).field_0;
  local_1ec0.space.vy.field_0._8_8_ = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_1ec0.space.vz.field_0._0_8_ = *(undefined8 *)&(space->vz).field_0;
  local_1ec0.space.vz.field_0._8_8_ = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  local_1f08 = this->prims;
  local_1f50.mapping = local_1f10.mapping;
  local_1f50.prims = &local_1f08;
  tbb::detail::d1::task_group_context::task_group_context(local_1e80,(context_traits)0x4,CUSTOM_CTX)
  ;
  local_1f30.my_begin = uVar4;
  local_1f30.my_end = uVar5;
  local_1f30.my_grainsize = 0x1000;
  local_1ed0.reduction = &local_1f10;
  local_1ed0.func = &local_1f50;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::avx::BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:549:31)>
            ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80,&local_1f30
             ,(BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80,
             &local_1ed0,&local_1f10,local_1e80);
  cVar12 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar12 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(local_1e80);
    BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1c80,
               (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80);
    lVar16 = local_1f00._0_8_ * 0x60 + -0x10;
    lVar13 = local_1f00._0_8_ * 0x10 + 0xbf0;
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar33._8_4_ = 0x7f800000;
    auVar33._0_8_ = 0x7f8000007f800000;
    auVar33._12_4_ = 0x7f800000;
    auVar34._8_4_ = 0xff800000;
    auVar34._0_8_ = 0xff800000ff800000;
    auVar34._12_4_ = 0xff800000;
    lVar18 = local_1f00._0_8_ * 0x10;
    auVar25 = auVar33;
    auVar27 = auVar34;
    auVar7 = auVar33;
    auVar26 = auVar34;
    for (uVar14 = 1; local_1f00._0_8_ != uVar14; uVar14 = uVar14 + 1) {
      auVar8 = vpaddd_avx(auVar23._0_16_,*(undefined1 (*) [16])(local_1c80 + lVar13));
      auVar23 = ZEXT1664(auVar8);
      *(undefined1 (*) [16])(local_1e80[0].padding + lVar18 + -0x58) = auVar8;
      auVar25 = vminps_avx(auVar25,*(undefined1 (*) [16])((long)auStack_1cd0 + lVar16));
      auVar27 = vmaxps_avx(auVar27,*(undefined1 (*) [16])((long)auStack_1cc0 + lVar16));
      auVar33 = vminps_avx(auVar33,*(undefined1 (*) [16])((long)auStack_1cb0 + lVar16));
      auVar24 = vsubps_avx(auVar27,auVar25);
      auVar34 = vmaxps_avx(auVar34,*(undefined1 (*) [16])((long)auStack_1ca0 + lVar16));
      auVar29 = vsubps_avx(auVar34,auVar33);
      auVar8 = vinsertps_avx(auVar29,auVar24,0x4c);
      auVar28 = vshufpd_avx(auVar24,auVar24,1);
      auVar28 = vinsertps_avx(auVar28,auVar29,0x9c);
      auVar24 = vunpcklps_avx(auVar24,auVar29);
      auVar29._0_4_ = (auVar28._0_4_ + auVar8._0_4_) * auVar24._0_4_ + auVar28._0_4_ * auVar8._0_4_;
      auVar29._4_4_ = (auVar28._4_4_ + auVar8._4_4_) * auVar24._4_4_ + auVar28._4_4_ * auVar8._4_4_;
      auVar29._8_4_ = (auVar28._8_4_ + auVar8._8_4_) * auVar24._8_4_ + auVar28._8_4_ * auVar8._8_4_;
      auVar29._12_4_ =
           (auVar28._12_4_ + auVar8._12_4_) * auVar24._12_4_ + auVar28._12_4_ * auVar8._12_4_;
      auVar7 = vminps_avx(auVar7,*(undefined1 (*) [16])((long)auStack_1c90 + lVar16));
      auVar26 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(local_1c80 + lVar16));
      uVar2 = vmovlps_avx(auVar29);
      *(undefined8 *)(local_1c80 + lVar18 + 0xdf0) = uVar2;
      auVar24 = vsubps_avx(auVar26,auVar7);
      auVar8 = vmovshdup_avx(auVar24);
      auVar28 = vshufpd_avx(auVar24,auVar24,1);
      *(float *)(local_1c80 + lVar18 + 0xdf8) =
           (auVar8._0_4_ + auVar28._0_4_) * auVar24._0_4_ + auVar8._0_4_ * auVar28._0_4_;
      *(undefined4 *)((long)&uStack_e84 + lVar18) = 0;
      lVar16 = lVar16 + -0x60;
      lVar13 = lVar13 + -0x10;
      lVar18 = lVar18 + -0x10;
    }
    uVar14 = 0xffffffffffffffff;
    auVar29 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
    uVar17 = 1;
    auVar24 = ZEXT816(0) << 0x40;
    auVar25._8_4_ = 0xff800000;
    auVar25._0_8_ = 0xff800000ff800000;
    auVar25._12_4_ = 0xff800000;
    auVar30._8_8_ = 0x100000001;
    auVar30._0_8_ = 0x100000001;
    auVar28._8_4_ = 0x7f800000;
    auVar28._0_8_ = 0x7f8000007f800000;
    auVar28._12_4_ = 0x7f800000;
    auVar27 = ZEXT816(0) << 0x40;
    pauVar20 = (undefined1 (*) [16])(local_1c80 + 0x50);
    lVar13 = 0;
    auVar8 = auVar28;
    auVar7 = auVar28;
    auVar26 = auVar25;
    auVar33 = auVar28;
    auVar34 = auVar25;
    while (uVar17 < (ulong)local_1f00._0_8_) {
      auVar24 = vpaddd_avx(auVar24,*(undefined1 (*) [16])(local_1c80 + lVar13 + 0xc00));
      auVar33 = vminps_avx(auVar33,pauVar20[-5]);
      auVar34 = vmaxps_avx(auVar34,pauVar20[-4]);
      auVar7 = vminps_avx(auVar7,pauVar20[-3]);
      auVar26 = vmaxps_avx(auVar26,pauVar20[-2]);
      auVar32 = vsubps_avx(auVar34,auVar33);
      auVar10 = vsubps_avx(auVar26,auVar7);
      auVar8 = vminps_avx(auVar8,pauVar20[-1]);
      auVar25 = vmaxps_avx(auVar25,*pauVar20);
      auVar11 = vsubps_avx(auVar25,auVar8);
      auVar9 = vshufps_avx(auVar32,auVar11,0x65);
      auVar9 = vblendps_avx(auVar9,auVar10,2);
      auVar31 = vshufps_avx(auVar32,auVar11,0x96);
      auVar6 = vinsertps_avx(auVar31,auVar10,0x90);
      auVar31 = vshufps_avx(auVar32,auVar11,0);
      auVar10 = vinsertps_avx(auVar31,auVar10,0x10);
      auVar31 = vpaddd_avx(auVar29,auVar24);
      auVar32 = vpsrld_avx(auVar31,ZEXT416((uint)logBlockSize));
      auVar31 = vpaddd_avx(auVar29,*(undefined1 (*) [16])(local_1e80[0].padding + lVar13 + -0x38));
      auVar22 = vpsrld_avx(auVar31,ZEXT416((uint)logBlockSize));
      auVar31 = vpsrad_avx(auVar32,0x1f);
      auVar35._8_8_ = 0x4f0000004f000000;
      auVar35._0_8_ = 0x4f0000004f000000;
      auVar11 = vpand_avx(auVar35,auVar31);
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar31 = vpand_avx(auVar36,auVar32);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar32 = vpsrad_avx(auVar22,0x1f);
      auVar35 = vpand_avx(auVar35,auVar32);
      auVar32 = vpand_avx(auVar22,auVar36);
      auVar32 = vcvtdq2ps_avx(auVar32);
      auVar22._0_4_ =
           (auVar10._0_4_ * (auVar9._0_4_ + auVar6._0_4_) + auVar9._0_4_ * auVar6._0_4_) *
           (auVar31._0_4_ + auVar11._0_4_) +
           (auVar32._0_4_ + auVar35._0_4_) * *(float *)(local_e80 + lVar13 + 0x10);
      auVar22._4_4_ =
           (auVar10._4_4_ * (auVar9._4_4_ + auVar6._4_4_) + auVar9._4_4_ * auVar6._4_4_) *
           (auVar31._4_4_ + auVar11._4_4_) +
           (auVar32._4_4_ + auVar35._4_4_) * *(float *)((long)afStack_e6c + lVar13);
      auVar22._8_4_ =
           (auVar10._8_4_ * (auVar9._8_4_ + auVar6._8_4_) + auVar9._8_4_ * auVar6._8_4_) *
           (auVar31._8_4_ + auVar11._8_4_) +
           (auVar32._8_4_ + auVar35._8_4_) * *(float *)((long)afStack_e6c + lVar13 + 4);
      auVar22._12_4_ =
           (auVar10._12_4_ * (auVar9._12_4_ + auVar6._12_4_) + auVar9._12_4_ * auVar6._12_4_) *
           (auVar31._12_4_ + auVar11._12_4_) +
           (auVar32._12_4_ + auVar35._12_4_) * *(float *)((long)afStack_e6c + lVar13 + 8);
      auVar9 = vcmpps_avx(auVar22,auVar28,1);
      auVar27 = vblendvps_avx(auVar27,auVar30,auVar9);
      auVar28 = vminps_avx(auVar22,auVar28);
      uVar17 = uVar17 + 1;
      auVar30 = vpsubd_avx(auVar30,_DAT_01f46b70);
      lVar13 = lVar13 + 0x10;
      pauVar20 = pauVar20 + 6;
    }
    local_1f30.my_end = auVar28._0_8_;
    local_1f30.my_begin = auVar28._8_8_;
    local_1f50.prims = (PrimRef **)auVar27._0_8_;
    local_1f50.mapping = (BinMapping<32UL> *)auVar27._8_8_;
    fVar21 = INFINITY;
    iVar19 = 0;
    for (uVar17 = 0; uVar17 != 3; uVar17 = uVar17 + 1) {
      if ((((*(float *)(local_1ee0 + uVar17 * 4) != 0.0) ||
           (NAN(*(float *)(local_1ee0 + uVar17 * 4)))) &&
          (fVar1 = *(float *)((long)&local_1f30.my_end + uVar17 * 4), fVar1 < fVar21)) &&
         (iVar3 = *(int *)((long)&local_1f50.prims + uVar17 * 4), iVar3 != 0)) {
        uVar14 = uVar17 & 0xffffffff;
        iVar19 = iVar3;
        fVar21 = fVar1;
      }
    }
    __return_storage_ptr__->sah = fVar21;
    __return_storage_ptr__->dim = (int)uVar14;
    (__return_storage_ptr__->field_2).pos = iVar19;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = local_1f00._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_1f00._16_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = local_1f00._24_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_1ee0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_1ee0._8_8_;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }